

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O3

nng_err nng_http_handler_alloc_static
                  (nng_http_handler **hp,char *uri,void *data,size_t size,char *ctype)

{
  nng_err nVar1;
  
  nVar1 = nni_http_handler_init_static(hp,uri,data,size,ctype);
  return nVar1;
}

Assistant:

nng_err
nng_http_handler_alloc_static(nng_http_handler **hp, const char *uri,
    const void *data, size_t size, const char *ctype)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_handler_init_static(hp, uri, data, size, ctype));
#else
	NNI_ARG_UNUSED(hp);
	NNI_ARG_UNUSED(uri);
	NNI_ARG_UNUSED(data);
	NNI_ARG_UNUSED(size);
	NNI_ARG_UNUSED(ctype);
	return (NNG_ENOTSUP);
#endif
}